

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::CheckerDeclarationSyntax::CheckerDeclarationSyntax
          (CheckerDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token keyword,Token name,
          AssertionItemPortListSyntax *portList,Token semi,
          SyntaxList<slang::syntax::MemberSyntax> *members,Token end,
          NamedBlockClauseSyntax *endBlockName)

{
  pointer ppMVar1;
  size_t sVar2;
  SyntaxNode *pSVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  long lVar6;
  undefined8 uVar7;
  
  uVar7 = name._0_8_;
  uVar5 = keyword._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,CheckerDeclaration,attributes);
  (this->keyword).kind = (short)uVar5;
  (this->keyword).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->keyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->keyword).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->keyword).info = keyword.info;
  (this->name).kind = (short)uVar7;
  (this->name).field_0x2 = (char)((ulong)uVar7 >> 0x10);
  (this->name).numFlags = (NumericTokenFlags)(char)((ulong)uVar7 >> 0x18);
  (this->name).rawLen = (int)((ulong)uVar7 >> 0x20);
  (this->name).info = name.info;
  this->portList = portList;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  uVar4 = *(undefined4 *)&(members->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (members->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->members).super_SyntaxListBase.super_SyntaxNode.kind =
       (members->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->members).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->members).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (members->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->members).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002da6d8;
  (this->members).super_SyntaxListBase.childCount = (members->super_SyntaxListBase).childCount;
  sVar2 = (members->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr =
       (members->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>)._M_ptr;
  (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (this->members).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002da718;
  (this->end).kind = end.kind;
  (this->end).field_0x2 = end._2_1_;
  (this->end).numFlags = (NumericTokenFlags)end.numFlags.raw;
  (this->end).rawLen = end.rawLen;
  (this->end).info = end.info;
  this->endBlockName = endBlockName;
  if (portList != (AssertionItemPortListSyntax *)0x0) {
    (portList->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  ppMVar1 = (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr
  ;
  sVar2 = (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  for (lVar6 = 0; sVar2 << 3 != lVar6; lVar6 = lVar6 + 8) {
    *(CheckerDeclarationSyntax **)(*(long *)((long)ppMVar1 + lVar6) + 8) = this;
  }
  if (endBlockName != (NamedBlockClauseSyntax *)0x0) {
    (endBlockName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

CheckerDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, Token name, AssertionItemPortListSyntax* portList, Token semi, const SyntaxList<MemberSyntax>& members, Token end, NamedBlockClauseSyntax* endBlockName) :
        MemberSyntax(SyntaxKind::CheckerDeclaration, attributes), keyword(keyword), name(name), portList(portList), semi(semi), members(members), end(end), endBlockName(endBlockName) {
        if (this->portList) this->portList->parent = this;
        this->members.parent = this;
        for (auto child : this->members)
            child->parent = this;
        if (this->endBlockName) this->endBlockName->parent = this;
    }